

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.cc
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  int rank;
  int p;
  int local_24;
  undefined1 local_20 [4];
  undefined1 local_1c [4];
  undefined1 local_18 [8];
  
  MPI_Init(local_1c,local_18);
  MPI_Comm_size(&ompi_mpi_comm_world,local_20);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello from ",0xb);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_24);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  int p, rank;

  MPI_Init(&argc, &argv);
  MPI_Comm_size(MPI_COMM_WORLD, &p);
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);

  std::cout << "Hello from " << rank << std::endl; 

  MPI_Finalize();

  return 0;
}